

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandIFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLevelMax;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_48 = 0;
  Extra_UtilGetoptReset();
  local_54 = 100;
  local_50 = 0;
  local_4c = 0;
  local_44 = 0;
  nLevelMax = 0;
LAB_001fef39:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"PCLspvh"), iVar5 = globalUtilOptind, iVar1 == 0x4c) {
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_001ff048;
    }
    nLevelMax = atoi(argv[globalUtilOptind]);
    uVar2 = nLevelMax;
joined_r0x001fef6f:
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_001ff052:
      iVar5 = -2;
      Abc_Print(-2,"usage: ifraig [-P num] [-C num] [-L num] [-spvh]\n");
      Abc_Print(-2,"\t         performs fraiging using a new method\n");
      Abc_Print(-2,"\t-P num : partition size (0 = partitioning is not used) [default = %d]\n",
                (ulong)local_44);
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_54);
      Abc_Print(-2,"\t-L num : limit on node level to fraig (0 = fraig all nodes) [default = %d]\n",
                (ulong)nLevelMax);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (local_4c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle considering sparse functions [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle proving the miter outputs [default = %s]\n",pcVar4);
      if (local_50 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_001ff11b:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  }
  if (iVar1 == -1) {
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      pcVar4 = "Empty network.\n";
    }
    else {
      if (pAVar3->ntkType == ABC_NTK_STRASH) {
        if (local_44 == 0) {
          pAVar3 = Abc_NtkIvyFraig(pAVar3,local_54,local_4c,local_48,0,local_50);
        }
        else {
          pAVar3 = Abc_NtkDarFraigPart(pAVar3,local_44,local_54,nLevelMax,local_50);
        }
        if (pAVar3 != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
          return 0;
        }
        Abc_Print(-1,"Command has failed.\n");
        return 0;
      }
      pcVar4 = "This command works only for strashed networks.\n";
    }
    iVar5 = -1;
    goto LAB_001ff11b;
  }
  if (iVar1 == 0x43) {
    if (globalUtilOptind < argc) {
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
      goto joined_r0x001fef6f;
    }
    pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
  }
  else {
    if (iVar1 == 0x76) {
      local_50 = local_50 ^ 1;
      goto LAB_001fef39;
    }
    if (iVar1 == 0x70) {
      local_48 = local_48 ^ 1;
      goto LAB_001fef39;
    }
    if (iVar1 == 0x73) {
      local_4c = local_4c ^ 1;
      goto LAB_001fef39;
    }
    if (iVar1 != 0x50) goto LAB_001ff052;
    if (globalUtilOptind < argc) {
      local_44 = atoi(argv[globalUtilOptind]);
      uVar2 = local_44;
      goto joined_r0x001fef6f;
    }
    pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
  }
LAB_001ff048:
  Abc_Print(-1,pcVar4);
  goto LAB_001ff052;
}

Assistant:

int Abc_CommandIFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, fProve, fVerbose, fDoSparse;
    int nConfLimit;
    int nPartSize;
    int nLevelMax;

    extern Abc_Ntk_t * Abc_NtkIvyFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarFraigPart( Abc_Ntk_t * pNtk, int nPartSize, int nConfLimit, int nLevelMax, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nPartSize    = 0;
    nLevelMax    = 0;
    nConfLimit   = 100;
    fDoSparse    = 0;
    fProve       = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PCLspvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPartSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
         case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 's':
            fDoSparse ^= 1;
            break;
        case 'p':
            fProve ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }

    if ( nPartSize > 0 )
        pNtkRes = Abc_NtkDarFraigPart( pNtk, nPartSize, nConfLimit, nLevelMax, fVerbose );
    else
        pNtkRes = Abc_NtkIvyFraig( pNtk, nConfLimit, fDoSparse, fProve, 0, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: ifraig [-P num] [-C num] [-L num] [-spvh]\n" );
    Abc_Print( -2, "\t         performs fraiging using a new method\n" );
    Abc_Print( -2, "\t-P num : partition size (0 = partitioning is not used) [default = %d]\n", nPartSize );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-L num : limit on node level to fraig (0 = fraig all nodes) [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-s     : toggle considering sparse functions [default = %s]\n", fDoSparse? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle proving the miter outputs [default = %s]\n", fProve? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}